

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O1

ON_LengthValue *
ON_LengthValue::CreateFromString
          (ON_LengthValue *__return_storage_ptr__,ON_ParseSettings parse_settings,wchar_t *string)

{
  ON_LengthValue *__return_storage_ptr___00;
  ON_LengthValue length_value;
  wchar_t *local_58;
  ON_LengthValue local_50;
  
  if ((string == (wchar_t *)0x0) || (*string == L'\0')) {
    ON_LengthValue(__return_storage_ptr__,&Unset);
  }
  else {
    local_58 = (wchar_t *)0x0;
    __return_storage_ptr___00 = &local_50;
    CreateFromSubString(__return_storage_ptr___00,parse_settings,string,-1,&local_58);
    if (local_58 <= string) {
      __return_storage_ptr___00 = &Unset;
    }
    ON_LengthValue(__return_storage_ptr__,__return_storage_ptr___00);
    ON_wString::~ON_wString(&local_50.m_length_as_string);
    ON_wString::~ON_wString(&local_50.m_length_unit_system.m_custom_unit_name);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_LengthValue ON_LengthValue::CreateFromString(
  ON_ParseSettings parse_settings,
  const wchar_t* string
)
{
  if ( nullptr == string || 0 == string[0] )
    return ON_LengthValue::Unset;

  const wchar_t* string_end = nullptr;
  const ON_LengthValue length_value = ON_LengthValue::CreateFromSubString(parse_settings, string, -1, &string_end);
  if (nullptr == string_end || !(string < string_end))
  {
    // Calling ON_ERROR here causes .NET trauma when ON_LengthValue::CreateFromString() is used for 
    // input validation.
    //ON_ERROR("Invalid input parameters.");
    return ON_LengthValue::Unset;
  }

  return length_value;
}